

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::Tailored::myanmarAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  long lVar1;
  long lVar2;
  qsizetype qVar3;
  bool *in_RCX;
  long in_RDX;
  qsizetype in_RSI;
  undefined4 in_EDI;
  long in_R8;
  long in_FS_OFFSET;
  qsizetype boundary;
  qsizetype i;
  qsizetype end;
  bool invalid;
  bool *local_48;
  long local_40;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  lVar2 = in_RDX + in_R8;
  while (local_40 < (long)in_RCX) {
    in_stack_fffffffffffffff4 = CONCAT13(0xaa,(int3)in_stack_fffffffffffffff4);
    qVar3 = myanmar_nextSyllableBoundary
                      ((char16_t *)CONCAT44(in_stack_fffffffffffffff4,in_EDI),in_RSI,in_RDX,in_RCX);
    local_48 = (bool *)(qVar3 - in_RDX);
    *(byte *)(lVar2 + local_40) = *(byte *)(lVar2 + local_40) & 0xfe | 1;
    *(byte *)(lVar2 + local_40) = *(byte *)(lVar2 + local_40) & 0xf7 | 8;
    if ((long)(in_RCX + -1) < (long)local_48) {
      local_48 = in_RCX;
    }
    while (local_40 = local_40 + 1, local_40 < (long)local_48) {
      *(byte *)(lVar2 + local_40) = *(byte *)(lVar2 + local_40) & 0xfe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void myanmarAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
    bool invalid;
    qsizetype boundary = myanmar_nextSyllableBoundary(text, from+i, end, &invalid) - from;

    attributes[i].graphemeBoundary = true;
    attributes[i].lineBreak = true;

    if (boundary > len-1)
            boundary = len;
    i++;
    while (i < boundary) {
        attributes[i].graphemeBoundary = false;
        ++i;
    }
    assert(i == boundary);
    }
}